

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::require_texture_query_variant(CompilerHLSL *this,uint32_t var_id)

{
  int iVar1;
  uint32_t id;
  uint uVar2;
  CompilerError *pCVar3;
  SPIRType *pSVar4;
  ulong uVar5;
  TextureSizeVariants *local_f0;
  bool local_b1;
  uint64_t mask;
  uint64_t *variant;
  ImageFormatNormalizedState norm_state;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [36];
  uint local_34;
  ID local_30;
  uint32_t bit;
  SPIRType *pSStack_28;
  bool uav;
  SPIRType *type;
  SPIRVariable *var;
  CompilerHLSL *pCStack_10;
  uint32_t var_id_local;
  CompilerHLSL *this_local;
  
  var._4_4_ = var_id;
  pCStack_10 = this;
  type = (SPIRType *)Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (type != (SPIRType *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  }
  pSStack_28 = Compiler::expression_type((Compiler *)this,var._4_4_);
  bit._3_1_ = (pSStack_28->image).sampled == 2;
  local_b1 = false;
  if ((this->field_0x2424 & 1) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_30,var._4_4_);
    local_b1 = Compiler::has_decoration((Compiler *)this,local_30,DecorationNonWritable);
  }
  if (local_b1 != false) {
    bit._3_1_ = 0;
  }
  local_34 = 0;
  switch((pSStack_28->image).dim) {
  case Dim1D:
    local_34 = (uint)(((pSStack_28->image).arrayed & 1U) != 0);
    break;
  case Dim2D:
    if (((pSStack_28->image).ms & 1U) == 0) {
      local_34 = 2;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        local_34 = 3;
      }
    }
    else {
      local_34 = 8;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        local_34 = 9;
      }
    }
    break;
  case Dim3D:
    local_34 = 4;
    break;
  case DimCube:
    local_34 = 6;
    if (((pSStack_28->image).arrayed & 1U) != 0) {
      local_34 = 7;
    }
    break;
  default:
    local_6d = 1;
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Unsupported query type.",&local_59);
    CompilerError::CompilerError(pCVar3,(string *)local_58);
    local_6d = 0;
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case DimBuffer:
    local_34 = 5;
  }
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->image);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  iVar1 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  if (iVar1 == 7) {
    local_34 = local_34 + 0x10;
  }
  else if (iVar1 == 8) {
    local_34 = local_34 + 0x20;
  }
  else if (iVar1 != 0xd) {
    variant._6_1_ = 1;
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&norm_state,"Unsupported query type.",(allocator *)((long)&variant + 7));
    CompilerError::CompilerError(pCVar3,(string *)&norm_state);
    variant._6_1_ = 0;
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  variant._0_4_ = image_format_to_normalized_state((pSStack_28->image).format);
  if ((bit._3_1_ & 1) == 0) {
    local_f0 = &this->required_texture_size_variants;
  }
  else {
    uVar5 = (ulong)(ImageFormatNormalizedState)variant;
    uVar2 = image_format_to_components((pSStack_28->image).format);
    local_f0 = (TextureSizeVariants *)
               ((this->required_texture_size_variants).uav[uVar5] + (uVar2 - 1));
  }
  uVar5 = 1L << ((byte)local_34 & 0x3f);
  if ((local_f0->srv & uVar5) == 0) {
    Compiler::force_recompile((Compiler *)this);
    local_f0->srv = uVar5 | local_f0->srv;
  }
  return;
}

Assistant:

void CompilerHLSL::require_texture_query_variant(uint32_t var_id)
{
	if (const auto *var = maybe_get_backing_variable(var_id))
		var_id = var->self;

	auto &type = expression_type(var_id);
	bool uav = type.image.sampled == 2;
	if (hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(var_id, DecorationNonWritable))
		uav = false;

	uint32_t bit = 0;
	switch (type.image.dim)
	{
	case Dim1D:
		bit = type.image.arrayed ? Query1DArray : Query1D;
		break;

	case Dim2D:
		if (type.image.ms)
			bit = type.image.arrayed ? Query2DMSArray : Query2DMS;
		else
			bit = type.image.arrayed ? Query2DArray : Query2D;
		break;

	case Dim3D:
		bit = Query3D;
		break;

	case DimCube:
		bit = type.image.arrayed ? QueryCubeArray : QueryCube;
		break;

	case DimBuffer:
		bit = QueryBuffer;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	switch (get<SPIRType>(type.image.type).basetype)
	{
	case SPIRType::Float:
		bit += QueryTypeFloat;
		break;

	case SPIRType::Int:
		bit += QueryTypeInt;
		break;

	case SPIRType::UInt:
		bit += QueryTypeUInt;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	auto norm_state = image_format_to_normalized_state(type.image.format);
	auto &variant = uav ? required_texture_size_variants
	                          .uav[uint32_t(norm_state)][image_format_to_components(type.image.format) - 1] :
	                      required_texture_size_variants.srv;

	uint64_t mask = 1ull << bit;
	if ((variant & mask) == 0)
	{
		force_recompile();
		variant |= mask;
	}
}